

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

void __thiscall PArray::WriteValue(PArray *this,FArchive *ar,void *addr)

{
  uint uVar1;
  
  FArchive::WriteByte(ar,'\x0f');
  FArchive::WriteCount(ar,this->ElementCount);
  if (this->ElementCount != 0) {
    uVar1 = 0;
    do {
      (*(this->ElementType->super_DObject)._vptr_DObject[7])(this->ElementType,ar,addr);
      addr = (void *)((long)addr + (ulong)this->ElementSize);
      uVar1 = uVar1 + 1;
    } while (uVar1 < this->ElementCount);
  }
  return;
}

Assistant:

void PArray::WriteValue(FArchive &ar, const void *addr) const
{
	ar.WriteByte(VAL_Array);
	ar.WriteCount(ElementCount);
	const BYTE *addrb = (const BYTE *)addr;
	for (unsigned i = 0; i < ElementCount; ++i)
	{
		ElementType->WriteValue(ar, addrb);
		addrb += ElementSize;
	}
}